

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::FileDescriptor::dependency(FileDescriptor *this,int index)

{
  once_flag *control;
  FileDescriptor *local_18;
  
  control = this->dependencies_once_;
  if ((control != (once_flag *)0x0) &&
     ((control->control_).super___atomic_base<unsigned_int>._M_i != 0xdd)) {
    local_18 = this;
    absl::lts_20250127::base_internal::
    CallOnceImpl<void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
              (&control->control_,SCHEDULE_COOPERATIVE_AND_KERNEL,DependenciesOnceInit,&local_18);
  }
  return this->dependencies_[index];
}

Assistant:

const FileDescriptor* FileDescriptor::dependency(int index) const {
  if (dependencies_once_) {
    // Do once init for all indices, as it's unlikely only a single index would
    // be called, and saves on absl::call_once allocations.
    absl::call_once(*dependencies_once_, FileDescriptor::DependenciesOnceInit,
                    this);
  }
  return dependencies_[index];
}